

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_AIR_SMITE(effect_handler_context_t *context)

{
  loc grid_00;
  _Bool _Var1;
  wchar_t dam;
  uint32_t uVar2;
  monster *pmVar3;
  anon_union_8_5_62f3dbed_for_which aVar4;
  ulong uVar5;
  wchar_t typ;
  uint uVar6;
  int iVar7;
  source sVar8;
  loc grid;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  iVar7 = 0;
  grid = (loc)loc(0,0);
  context->ident = true;
  msg("The powers of Air rain down destruction!");
  do {
    if (iVar7 == 8) {
      return true;
    }
    for (uVar6 = 0; uVar2 = Rand_div(3), uVar6 != 0x13; uVar6 = uVar6 + 1) {
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      scatter(cave,&grid,grid_00,uVar2 + L'\x01',true);
      _Var1 = loc_eq((loc_conflict)grid,player->grid);
      if (((!_Var1) && (_Var1 = square_ispassable(cave,grid), _Var1)) &&
         ((pmVar3 = square_monster(cave,grid), 3 < uVar6 || (pmVar3 != (monster *)0x0))))
      goto LAB_00138b76;
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
LAB_00138b76:
    uVar2 = Rand_div(3);
    typ = L'\x01';
    if (uVar2 == 0) {
      sVar8 = source_player();
      aVar4 = sVar8.which;
      uVar5 = (ulong)sVar8.what;
      typ = L'\x0f';
    }
    else {
      uVar2 = Rand_div(2);
      sVar8 = source_player();
      aVar4 = sVar8.which;
      uVar5 = (ulong)sVar8.what;
      if (uVar2 == 0) {
        typ = L'\x05';
      }
    }
    sVar8.which.trap = aVar4.trap;
    sVar8._0_8_ = uVar5;
    project(sVar8,L'\x01',grid,dam,typ,L'y',L'\0','\0',(object *)0x0);
    event_signal_pause(EVENT_PAUSE,L'\n');
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool effect_handler_AIR_SMITE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int i, j;
	struct loc grid = loc(0, 0);
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	context->ident = true;

	/* Due warning. */
	msg("The powers of Air rain down destruction!");

	/* Multiple gravity, light, and electricity balls. */
	for (i = 0; i < 8; i++) {
		/* First, we find the spot. */
		for (j = 0; j < 20; j++) {
			/* Pick a (short) distance. */
			int d = randint1(3);

			/* Admit failure.  Switch to Plan B. */
			if (j == 19) {
				grid = player->grid;
				break;
			}

			/* Pick a location */
			scatter(cave, &grid, player->grid, d, true);

			/* Not on top of the player. */
			if (loc_eq(grid, player->grid)) continue;

			/* Require passable terrain */
			if (!square_ispassable(cave, grid)) continue;

			/* Slight preference for actual monsters. */
			if (square_monster(cave, grid)) {
				break;
			} else if (j > 3) {
				/* Will accept any passable grid after a few tries. */
				break;
			}
		}

		/* Choice of 3 */
		if (one_in_(3)) {
			project(source_player(), 1, grid, dam, PROJ_GRAVITY, flg, 0, 0,
					NULL);
		} else if (one_in_(2)) {
			project(source_player(), 1, grid, dam, PROJ_LIGHT, flg, 0, 0, NULL);
		} else {
			project(source_player(), 1, grid, dam, PROJ_ELEC, flg, 0, 0, NULL);
		}

		/* This is a bombardment.  Make it look like one. */
		event_signal_pause(EVENT_PAUSE, 10);
	}
	return true;
}